

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcElementType::~IfcElementType(IfcElementType *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  
  *(undefined8 *)&this[-1].super_IfcTypeProduct.super_IfcTypeObject.field_0x50 = 0x8071f8;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x38 = 0x8072c0;
  *(pointer *)
   ((long)&this[-1].super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
           ._M_impl + 8) = (pointer)(vtable + 0x40);
  *(undefined8 *)&this[-1].super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.have = 0x807248;
  *(undefined8 *)&this[-1].super_IfcTypeProduct.Tag.have = 0x807270;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject = 0x807298;
  puVar2 = *(undefined1 **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x10;
  puVar1 = &(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&this[-1].super_IfcTypeProduct.super_IfcTypeObject.field_0x50 = 0x8073d8;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x38 = 0x807478;
  *(pointer *)
   ((long)&this[-1].super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
           ._M_impl + 8) =
       (pointer)(IfcTypeProduct-in-Assimp::IFC::Schema_2x3::IfcElementType::construction_vtable +
                0x40);
  *(undefined8 *)&this[-1].super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.have = 0x807428;
  *(undefined8 *)&this[-1].super_IfcTypeProduct.Tag.have = 0x807450;
  if (*(undefined1 **)&this[-1].field_0x170 != &this[-1].field_0x180) {
    operator_delete(*(undefined1 **)&this[-1].field_0x170,*(long *)&this[-1].field_0x180 + 1);
  }
  puVar1 = &this[-1].super_IfcTypeProduct.super_IfcTypeObject.field_0x50;
  pvVar3 = *(void **)&this[-1].super_IfcTypeProduct.field_0x150;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this[-1].field_0x160 - (long)pvVar3);
  }
  IfcTypeObject::~IfcTypeObject((IfcTypeObject *)puVar1,&PTR_construction_vtable_24__008072e0);
  operator_delete(puVar1,0x198);
  return;
}

Assistant:

IfcElementType() : Object("IfcElementType") {}